

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_memory_manager.cpp
# Opt level: O2

void __thiscall duckdb::TemporaryMemoryState::SetZero(TemporaryMemoryState *this)

{
  idx_t *piVar1;
  TemporaryMemoryManager *pTVar2;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> local_20;
  
  ::std::unique_lock<std::mutex>::unique_lock(&local_20,&this->temporary_memory_manager->lock);
  pTVar2 = this->temporary_memory_manager;
  piVar1 = &pTVar2->remaining_size;
  *piVar1 = *piVar1 - (this->remaining_size).super___atomic_base<unsigned_long>._M_i;
  LOCK();
  (this->remaining_size).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  piVar1 = &pTVar2->remaining_size;
  *piVar1 = *piVar1 + (this->remaining_size).super___atomic_base<unsigned_long>._M_i;
  pTVar2 = this->temporary_memory_manager;
  piVar1 = &pTVar2->reservation;
  *piVar1 = *piVar1 - (this->reservation).super___atomic_base<unsigned_long>._M_i;
  LOCK();
  (this->reservation).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  piVar1 = &pTVar2->reservation;
  *piVar1 = *piVar1 + (this->reservation).super___atomic_base<unsigned_long>._M_i;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void TemporaryMemoryState::SetZero() {
	auto guard = temporary_memory_manager.Lock();
	temporary_memory_manager.SetRemainingSize(*this, 0);
	temporary_memory_manager.SetReservation(*this, 0);
}